

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

int Assimp_Dump(char **params,uint num)

{
  int iVar1;
  char *pcVar2;
  aiScene *scene_00;
  undefined8 uVar3;
  FILE *__stream;
  char *pcVar4;
  char *local_180;
  FILE *o;
  aiScene *scene;
  long local_f0;
  size_type s;
  uint i_1;
  bool compressed;
  bool shortened;
  bool binary;
  ImportData import;
  string local_a8 [4];
  uint i;
  string cmd;
  string local_80 [8];
  string out;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string in;
  char *fail;
  uint num_local;
  char **params_local;
  
  in.field_2._8_8_ = anon_var_dwarf_1f243;
  iVar1 = strcmp(*params,"-h");
  if (((iVar1 == 0) || (iVar1 = strcmp(*params,"--help"), iVar1 == 0)) ||
     (iVar1 = strcmp(*params,"-?"), iVar1 == 0)) {
    printf("%s",AICMD_MSG_DUMP_HELP);
    params_local._4_4_ = 0;
  }
  else if (num == 0) {
    printf("%s",in.field_2._8_8_);
    params_local._4_4_ = 1;
  }
  else {
    pcVar2 = *params;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,pcVar2,&local_49);
    std::allocator<char>::~allocator(&local_49);
    cmd.field_2._M_local_buf[0xe] = '\0';
    cmd.field_2._M_local_buf[0xc] = '\0';
    if (num < 2) {
      std::allocator<char>::allocator();
      cmd.field_2._M_local_buf[0xc] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"-",(allocator<char> *)(cmd.field_2._M_local_buf + 0xd));
    }
    else {
      pcVar2 = params[1];
      std::allocator<char>::allocator();
      cmd.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,pcVar2,(allocator<char> *)(cmd.field_2._M_local_buf + 0xf));
    }
    if ((cmd.field_2._M_local_buf[0xc] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(cmd.field_2._M_local_buf + 0xd));
    }
    if ((cmd.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(cmd.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::string(local_a8);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    import._44_4_ = 2;
    if (*pcVar2 == '-') {
      import._44_4_ = 1;
    }
    for (; (uint)import._44_4_ < num; import._44_4_ = import._44_4_ + 1) {
      if (params[(uint)import._44_4_] != (char *)0x0) {
        std::__cxx11::string::append((char *)local_a8);
        std::__cxx11::string::append((char *)local_a8);
      }
    }
    ImportData::ImportData((ImportData *)&i_1);
    ProcessStandardArguments((ImportData *)&i_1,params + 1,num - 1);
    s._7_1_ = 0;
    s._6_1_ = 0;
    s._5_1_ = 0;
    for (s._0_4_ = 1; (uint)s < num; s._0_4_ = (uint)s + 1) {
      if (params[(uint)s] != (char *)0x0) {
        iVar1 = strcmp(params[(uint)s],"-b");
        if ((iVar1 == 0) || (iVar1 = strcmp(params[(uint)s],"--binary"), iVar1 == 0)) {
          s._7_1_ = 1;
        }
        else {
          iVar1 = strcmp(params[(uint)s],"-s");
          if ((iVar1 == 0) || (iVar1 = strcmp(params[(uint)s],"--short"), iVar1 == 0)) {
            s._6_1_ = 1;
          }
          else {
            iVar1 = strcmp(params[(uint)s],"-z");
            if ((iVar1 == 0) || (iVar1 = strcmp(params[(uint)s],"--compressed"), iVar1 == 0)) {
              s._5_1_ = 1;
            }
          }
        }
      }
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    if (*pcVar2 == '-') {
      local_f0 = std::__cxx11::string::find_last_of((char)local_48,0x2e);
      if (local_f0 == -1) {
        local_f0 = std::__cxx11::string::length();
      }
      std::__cxx11::string::substr((ulong)&scene,(ulong)local_48);
      std::__cxx11::string::operator=(local_80,(string *)&scene);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::append((char *)local_80);
      if (((s._6_1_ & 1) != 0) && ((s._7_1_ & 1) != 0)) {
        std::__cxx11::string::append((char *)local_80);
      }
    }
    scene_00 = ImportModel((ImportData *)&i_1,(string *)local_48);
    if (scene_00 == (aiScene *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      printf("assimp dump: Unable to load input file %s\n",uVar3);
      params_local._4_4_ = 5;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      if ((s._7_1_ & 1) == 0) {
        local_180 = "wt";
      }
      else {
        local_180 = "wb";
      }
      __stream = fopen(pcVar2,local_180);
      if (__stream == (FILE *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        printf("assimp dump: Unable to open output file %s\n",uVar3);
        params_local._4_4_ = 0xc;
      }
      else {
        if ((s._7_1_ & 1) == 0) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          WriteDump(scene_00,(FILE *)__stream,pcVar2,pcVar4,(bool)(s._6_1_ & 1));
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          WriteBinaryDump(scene_00,(FILE *)__stream,pcVar2,pcVar4,(bool)(s._6_1_ & 1),
                          (bool)(s._5_1_ & 1),(ImportData *)&i_1);
        }
        fclose(__stream);
        if (((s._5_1_ & 1) != 0) && ((s._7_1_ & 1) != 0)) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          CompressBinaryDump(pcVar2,0x200);
        }
        uVar3 = std::__cxx11::string::c_str();
        printf("assimp dump: Wrote output dump %s\n",uVar3);
        params_local._4_4_ = 0;
      }
    }
    ImportData::~ImportData((ImportData *)&i_1);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)local_48);
  }
  return params_local._4_4_;
}

Assistant:

int Assimp_Dump (const char* const* params, unsigned int num)
{
	const char* fail = "assimp dump: Invalid number of arguments. "
			"See \'assimp dump --help\'\r\n";

	// --help
	if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
		printf("%s",AICMD_MSG_DUMP_HELP);
		return 0;
	}

	// asssimp dump in out [options]
	if (num < 1) {
		printf("%s", fail);
		return 1;
	}

	std::string in  = std::string(params[0]);
	std::string out = (num > 1 ? std::string(params[1]) : std::string("-"));

	// store full command line
	std::string cmd;
	for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)	{
		if (!params[i])continue;
		cmd.append(params[i]);
		cmd.append(" ");
	}

	// get import flags
	ImportData import;
	ProcessStandardArguments(import,params+1,num-1);

	bool binary = false, shortened = false,compressed=false;
	
	// process other flags
	for (unsigned int i = 1; i < num;++i)		{
		if (!params[i])continue;
		if (!strcmp( params[i], "-b") || !strcmp( params[i], "--binary")) {
			binary = true;
		}
		else if (!strcmp( params[i], "-s") || !strcmp( params[i], "--short")) {
			shortened = true;
		}
		else if (!strcmp( params[i], "-z") || !strcmp( params[i], "--compressed")) {
			compressed = true;
		}
#if 0
		else if (i > 2 || params[i][0] == '-') {
			::printf("Unknown parameter: %s\n",params[i]);
			return 10;
		}
#endif
	}

	if (out[0] == '-') {
		// take file name from input file
		std::string::size_type s = in.find_last_of('.');
		if (s == std::string::npos) {
			s = in.length();
		}

		out = in.substr(0,s);
		out.append((binary ? ".assbin" : ".assxml"));
		if (shortened && binary) {
			out.append(".regress");
		}
	}

	// import the main model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		printf("assimp dump: Unable to load input file %s\n",in.c_str());
		return 5;
	}

	// open the output file and build the dump
	FILE* o = ::fopen(out.c_str(),(binary ? "wb" : "wt"));
	if (!o) {
		printf("assimp dump: Unable to open output file %s\n",out.c_str());
		return 12;
	}

	if (binary) {
		WriteBinaryDump (scene,o,in.c_str(),cmd.c_str(),shortened,compressed,import);
	}
	else WriteDump (scene,o,in.c_str(),cmd.c_str(),shortened);
	fclose(o);

	if (compressed && binary) {
		CompressBinaryDump(out.c_str(),ASSBIN_HEADER_LENGTH);
	}

	printf("assimp dump: Wrote output dump %s\n",out.c_str());
	return 0;
}